

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

uchar * nvpair_unpack_nvlist_array
                  (_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp,nvlist_t **firstel)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  undefined8 *__ptr;
  nvlist_t *pnVar4;
  nvpair_t *ele;
  int _serrno;
  size_t sizeup;
  uint j;
  uint ii;
  nvpair_t *tmpnvp;
  nvlist_t **value;
  nvlist_t **firstel_local;
  size_t *leftp_local;
  uchar *ptr_local;
  nvpair_t *nvp_local;
  uchar *puStack_10;
  _Bool isbe_local;
  
  if (nvp->nvp_type != 0xb) {
    __assert_fail("nvp->nvp_type == 11",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x428,
                  "const unsigned char *nvpair_unpack_nvlist_array(_Bool, nvpair_t *, const unsigned char *, size_t *, nvlist_t **)"
                 );
  }
  uVar2 = nvp->nvp_nitems * 0x13;
  if (((nvp->nvp_nitems == 0) || (uVar2 < nvp->nvp_nitems)) || (*leftp < uVar2)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    puStack_10 = (uchar *)0x0;
  }
  else {
    __ptr = (undefined8 *)malloc(nvp->nvp_nitems << 3);
    if (__ptr == (undefined8 *)0x0) {
      puStack_10 = (uchar *)0x0;
    }
    else {
      for (sizeup._4_4_ = 0; (ulong)sizeup._4_4_ < nvp->nvp_nitems; sizeup._4_4_ = sizeup._4_4_ + 1)
      {
        pnVar4 = nvlist_create(0);
        __ptr[sizeup._4_4_] = pnVar4;
        if (__ptr[sizeup._4_4_] == 0) {
LAB_00110ff5:
          piVar3 = __errno_location();
          iVar1 = *piVar3;
          for (sizeup._0_4_ = 0; (uint)sizeup <= sizeup._4_4_; sizeup._0_4_ = (uint)sizeup + 1) {
            nvlist_destroy((nvlist_t *)__ptr[(uint)sizeup]);
          }
          free(__ptr);
          piVar3 = __errno_location();
          *piVar3 = iVar1;
          return (uchar *)0x0;
        }
        if (sizeup._4_4_ != 0) {
          ele = nvpair_allocv(" ",5,__ptr[sizeup._4_4_],0,0);
          if (ele == (nvpair_t *)0x0) goto LAB_00110ff5;
          nvlist_set_array_next((nvlist_t *)__ptr[sizeup._4_4_ - 1],ele);
        }
      }
      nvlist_set_flags((nvlist_t *)__ptr[nvp->nvp_nitems - 1],0x100);
      nvp->nvp_data = (uint64_t)__ptr;
      *firstel = (nvlist_t *)*__ptr;
      puStack_10 = ptr;
    }
  }
  return puStack_10;
}

Assistant:

const unsigned char *
nvpair_unpack_nvlist_array(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp, nvlist_t **firstel)
{
	nvlist_t **value;
	nvpair_t *tmpnvp;
	unsigned int ii, j;
	size_t sizeup;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_NVLIST_ARRAY);

	sizeup = sizeof(struct nvpair_header) * nvp->nvp_nitems;
	if (nvp->nvp_nitems == 0 || sizeup < nvp->nvp_nitems ||
	    sizeup > *leftp) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nv_malloc(nvp->nvp_nitems * sizeof(*value));
	if (value == NULL)
		return (NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		value[ii] = nvlist_create(0);
		if (value[ii] == NULL)
			goto fail;
		if (ii > 0) {
			tmpnvp = nvpair_allocv(" ", NV_TYPE_NVLIST,
			    (uint64_t)(uintptr_t)value[ii], 0, 0);
			if (tmpnvp == NULL)
				goto fail;
			nvlist_set_array_next(value[ii - 1], tmpnvp);
		}
	}
	nvlist_set_flags(value[nvp->nvp_nitems - 1], NV_FLAG_IN_ARRAY);

	nvp->nvp_data = (uint64_t)(uintptr_t)value;
	*firstel = value[0];

	return (ptr);
fail:
	ERRNO_SAVE();
	for (j = 0; j <= ii; j++)
		nvlist_destroy(value[j]);
	nv_free(value);
	ERRNO_RESTORE();

	return (NULL);
}